

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O2

int lws_plat_ifname_to_hwaddr(int fd,char *ifname,uint8_t *hwaddr,int len)

{
  int iVar1;
  ifreq i;
  
  i.ifr_ifru.ifru_map.mem_start = 0;
  i.ifr_ifru.ifru_map.mem_end = 0;
  i.ifr_ifrn._0_8_ = 0;
  i.ifr_ifrn._8_8_ = 0;
  i.ifr_ifru._16_8_ = 0;
  lws_strncpy((char *)&i,ifname,0x10);
  iVar1 = ioctl(fd,0x8927,&i);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    *(undefined2 *)(hwaddr + 4) = i.ifr_ifru.ifru_map.mem_start._6_2_;
    *(undefined4 *)hwaddr = i.ifr_ifru.ifru_map.mem_start._2_4_;
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int
lws_plat_ifname_to_hwaddr(int fd, const char *ifname, uint8_t *hwaddr, int len)
{
#if defined(__linux__)
	struct ifreq i;

	memset(&i, 0, sizeof(i));
	lws_strncpy(i.ifr_name, ifname, sizeof(i.ifr_name));

	if (ioctl(fd, SIOCGIFHWADDR, &i) < 0)
		return -1;

	memcpy(hwaddr, &i.ifr_hwaddr.sa_data, 6);

	return 6;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}